

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkUpdateNetwork(Abc_ShaMan_t *p,int fAnd)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Aig_t *pAVar1;
  int Lit;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *p_02;
  Vec_Int_t *pVVar7;
  int iLitConst1;
  int iLit;
  int ObjId;
  int k;
  int j;
  int i;
  Abc_Obj_t *pNew;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vBucket;
  Vec_Ptr_t *vRepl;
  Vec_Ptr_t *vOrig;
  Vec_Int_t *vMap2Repl;
  Vec_Int_t *vInput;
  Abc_Ntk_t *pNtk;
  int fAnd_local;
  Abc_ShaMan_t *p_local;
  
  pAVar5 = Abc_AigConst1(p->pNtk);
  Lit = Abc_ObjToLit(pAVar5);
  p_00 = Vec_PtrAlloc(p->nStartCols);
  p_01 = Vec_PtrAlloc(p->nStartCols);
  for (k = 0; k < p->nStartCols; k = k + 1) {
    iVar2 = Vec_IntEntry(p->vObj2Lit,k);
    if ((fAnd != 0) && (iVar3 = Abc_LitIsCompl(iVar2), iVar3 != 0)) {
      __assert_fail("!fAnd || !Abc_LitIsCompl(iLit)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                    ,0x263,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
    }
    pNtk_00 = p->pNtk;
    iVar3 = Abc_Lit2Var(iVar2);
    pAVar5 = Abc_NtkObj(pNtk_00,iVar3);
    if (fAnd == 0) {
      pAVar6 = Abc_AigConst1(p->pNtk);
      iVar2 = Abc_LitIsCompl(iVar2);
      _j = Abc_ObjNotCond(pAVar6,(uint)((iVar2 != 0 ^ 0xffU) & 1));
    }
    else {
      _j = Abc_AigConst1(p->pNtk);
    }
    Vec_PtrPush(p_00,pAVar5);
    Vec_PtrPush(p_01,_j);
    p->nCountGates = p->nCountGates + -1;
  }
  k = 0;
  do {
    iVar2 = Vec_PtrSize(p->vBuckets);
    if (iVar2 <= k) {
      if (p->fVerbose != 0) {
        printf("Total gates collected = %d.  Total gates constructed = %d.\n",
               (ulong)(uint)p->nFoundGates,(ulong)(uint)p->nCountGates);
      }
      iVar2 = Abc_NtkObjNumMax(p->pNtk);
      pVVar7 = Vec_IntStartFull(iVar2);
      for (k = 0; iVar2 = Vec_PtrSize(p_00), k < iVar2; k = k + 1) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_00,k);
        uVar4 = Abc_ObjId(pAVar5);
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_01,k);
        iVar2 = Abc_ObjToLit(pAVar5);
        Vec_IntWriteEntry(pVVar7,uVar4,iVar2);
      }
      Vec_PtrFree(p_00);
      Vec_PtrFree(p_01);
      for (k = 0; iVar2 = Vec_PtrSize(p->pNtk->vObjs), k < iVar2; k = k + 1) {
        pAVar5 = Abc_NtkObj(p->pNtk,k);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          iVar2 = Abc_ObjIsCo(pAVar5);
          if ((iVar2 != 0) || (iVar2 = Abc_ObjIsNode(pAVar5), iVar2 != 0)) {
            iVar2 = Abc_ObjFaninId0(pAVar5);
            iVar2 = Vec_IntEntry(pVVar7,iVar2);
            if (-1 < iVar2) {
              if ((iVar2 == Lit) && (fAnd != 0)) {
                *(uint *)&pAVar5->field_0x14 =
                     *(uint *)&pAVar5->field_0x14 & 0xfffffbff |
                     (*(uint *)&pAVar5->field_0x14 >> 10 & 1 ^ 1) << 10;
                iVar2 = Abc_Lit2Var(Lit);
                Vec_IntWriteEntry(&pAVar5->vFanins,0,iVar2);
              }
              else {
                uVar4 = Abc_LitIsCompl(iVar2);
                *(uint *)&pAVar5->field_0x14 =
                     *(uint *)&pAVar5->field_0x14 & 0xfffffbff |
                     ((*(uint *)&pAVar5->field_0x14 >> 10 & 1 ^ uVar4) & 1) << 10;
                iVar2 = Abc_Lit2Var(iVar2);
                Vec_IntWriteEntry(&pAVar5->vFanins,0,iVar2);
              }
            }
          }
          iVar2 = Abc_ObjIsNode(pAVar5);
          if (iVar2 != 0) {
            iVar2 = Abc_ObjFaninId1(pAVar5);
            iVar2 = Vec_IntEntry(pVVar7,iVar2);
            if (-1 < iVar2) {
              if ((iVar2 == Lit) && (fAnd != 0)) {
                *(uint *)&pAVar5->field_0x14 =
                     *(uint *)&pAVar5->field_0x14 & 0xfffff7ff |
                     (*(uint *)&pAVar5->field_0x14 >> 0xb & 1 ^ 1) << 0xb;
                iVar2 = Abc_Lit2Var(Lit);
                Vec_IntWriteEntry(&pAVar5->vFanins,1,iVar2);
              }
              else {
                uVar4 = Abc_LitIsCompl(iVar2);
                *(uint *)&pAVar5->field_0x14 =
                     *(uint *)&pAVar5->field_0x14 & 0xfffff7ff |
                     ((*(uint *)&pAVar5->field_0x14 >> 0xb & 1 ^ uVar4) & 1) << 0xb;
                iVar2 = Abc_Lit2Var(iVar2);
                Vec_IntWriteEntry(&pAVar5->vFanins,1,iVar2);
              }
            }
          }
        }
      }
      Vec_IntFree(pVVar7);
      if (fAnd == 0) {
        vInput = (Vec_Int_t *)Abc_NtkBalanceExor(p->pNtk,1,0);
      }
      else {
        vInput = (Vec_Int_t *)Abc_NtkBalance(p->pNtk,0,0,1);
      }
      return (Abc_Ntk_t *)vInput;
    }
    p_02 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,k);
    for (ObjId = 0; iVar2 = Vec_PtrSize(p_02), ObjId < iVar2; ObjId = ObjId + 1) {
      pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_02,ObjId);
      for (iLit = 2; iVar2 = Vec_IntSize(pVVar7), iLit < iVar2; iLit = iLit + 1) {
        iVar2 = Vec_IntEntry(pVVar7,iLit);
        iVar3 = Vec_IntSize(p->vObj2Lit);
        if (iVar3 <= iVar2) {
          __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x278,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
        }
        if (p->nStartCols <= iVar2) break;
        if (p->nStartCols <= iVar2) {
          __assert_fail("ObjId < p->nStartCols",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x27b,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
        }
        iVar3 = Vec_IntEntry(pVVar7,0);
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar2);
        if (fAnd == 0) {
          pAVar1 = (Abc_Aig_t *)p->pNtk->pManFunc;
          pAVar6 = Abc_ObjFromLit(p->pNtk,iVar3);
          _j = Abc_AigXor(pAVar1,pAVar5,pAVar6);
        }
        else {
          pAVar1 = (Abc_Aig_t *)p->pNtk->pManFunc;
          pAVar6 = Abc_ObjFromLit(p->pNtk,iVar3);
          _j = Abc_AigAnd(pAVar1,pAVar5,pAVar6);
        }
        Vec_PtrWriteEntry(p_01,iVar2,_j);
        p->nCountGates = p->nCountGates + 1;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkUpdateNetwork( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vInput, * vMap2Repl;
    Vec_Ptr_t * vOrig, * vRepl, * vBucket;
    Abc_Obj_t * pObj, * pNew;
    int i, j, k, ObjId, iLit;
    int iLitConst1 = Abc_ObjToLit( Abc_AigConst1(p->pNtk) );

    vOrig = Vec_PtrAlloc( p->nStartCols );
    vRepl = Vec_PtrAlloc( p->nStartCols );
    for ( i = 0; i < p->nStartCols; i++ )
    {
        iLit = Vec_IntEntry( p->vObj2Lit, i );
        assert( !fAnd || !Abc_LitIsCompl(iLit) );

        pObj = Abc_NtkObj( p->pNtk, Abc_Lit2Var(iLit) );

        if ( fAnd )
            pNew = Abc_AigConst1(p->pNtk);
        else
            pNew = Abc_ObjNotCond( Abc_AigConst1(p->pNtk), !Abc_LitIsCompl(iLit) );

        Vec_PtrPush( vOrig, pObj );
        Vec_PtrPush( vRepl, pNew );

        p->nCountGates--;
    }

    // go through the columns
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            if ( ObjId >= p->nStartCols )
                break;
            assert( ObjId < p->nStartCols );
            iLit = Vec_IntEntry( vInput, 0 );

            pNew = (Abc_Obj_t *)Vec_PtrEntry( vRepl, ObjId );
            if ( fAnd )
                pNew = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            else
                pNew = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            Vec_PtrWriteEntry( vRepl, ObjId, pNew );
            p->nCountGates++;
        }
    }

    if ( p->fVerbose )
        printf( "Total gates collected = %d.  Total gates constructed = %d.\n", p->nFoundGates, p->nCountGates );

    // create map of originals
    vMap2Repl = Vec_IntStartFull( Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrig, pObj, i )
    {
//        printf( "Replacing %d by %d.\n", Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
        Vec_IntWriteEntry( vMap2Repl, Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
    }
    Vec_PtrFree( vOrig );
    Vec_PtrFree( vRepl );

    // update fanin pointers
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) || Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId0(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl0 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl0 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLit) );
                }
            }
        }
        if ( Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId1(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl1 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl1 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLit) );
                }
            }
        }
    }
    Vec_IntFree( vMap2Repl );

//    pNtk = Abc_NtkRestrash( p->pNtk, 1 );
    if ( fAnd )
        pNtk = Abc_NtkBalance( p->pNtk, 0, 0, 1 );
    else
        pNtk = Abc_NtkBalanceExor( p->pNtk, 1, 0 );
    return pNtk;
}